

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::CLUFactor<double>::vSolveUright
          (CLUFactor<double> *this,double *vec,int *vidx,double *rhs,int *ridx,int rn,double eps)

{
  pointer pdVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  uint local_b0;
  int local_ac;
  int *local_a8;
  double local_a0;
  int *local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  pointer local_78;
  double *local_70;
  int *local_68;
  int *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_80 = (this->row).orig;
  local_60 = (this->row).perm;
  local_88 = (this->col).orig;
  local_a8 = (this->u).col.idx;
  local_78 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_90 = (this->u).col.len;
  local_98 = (this->u).col.start;
  local_b0 = 0;
  local_ac = rn;
  local_a0 = eps;
  do {
    do {
      if (local_ac < 1) {
        return local_b0;
      }
      iVar2 = deQueueMax(ridx,&local_ac);
      iVar5 = local_80[iVar2];
      dVar10 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar5] * rhs[iVar5];
      rhs[iVar5] = 0.0;
    } while (ABS(dVar10) <= local_a0);
    iVar5 = local_88[iVar2];
    vidx[local_b0] = iVar5;
    vec[iVar5] = dVar10;
    iVar4 = local_90[iVar5];
    dVar11 = -dVar10;
    lVar7 = (long)local_98[iVar5] << 2;
    uStack_40 = 0;
    uStack_50 = 0x8000000000000000;
    piVar3 = local_a8;
    local_70 = vec;
    local_68 = vidx;
    local_58 = dVar11;
    local_48 = dVar10;
    for (; 0 < iVar4; iVar4 = iVar4 + -1) {
      iVar5 = *(int *)((long)piVar3 + lVar7);
      dVar9 = rhs[iVar5];
      dVar8 = *(double *)((long)local_78 + lVar7 * 2);
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        dVar9 = dVar9 - dVar8 * dVar10;
        rhs[iVar5] = (double)(-(ulong)(dVar9 == 0.0) & 0x2b2bff2ee48e0530) + dVar9;
      }
      else {
        dVar8 = dVar8 * dVar11;
        if (local_a0 < ABS(dVar8)) {
          rhs[iVar5] = dVar8;
          enQueueMax(ridx,&local_ac,local_60[iVar5]);
          piVar3 = local_a8;
          dVar10 = local_48;
          dVar11 = local_58;
        }
      }
      lVar7 = lVar7 + 4;
    }
    local_b0 = local_b0 + 1;
    vec = local_70;
    vidx = local_68;
  } while ((double)local_ac <= (double)iVar2 * 0.2);
  pdVar1 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = *ridx; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    iVar5 = local_80[uVar6];
    dVar10 = pdVar1[iVar5] * rhs[iVar5];
    rhs[iVar5] = 0.0;
    if (local_a0 < ABS(dVar10)) {
      iVar5 = local_88[uVar6];
      local_68[(int)local_b0] = iVar5;
      local_70[iVar5] = dVar10;
      lVar7 = (long)local_98[iVar5] << 2;
      for (iVar5 = local_90[iVar5]; 0 < iVar5; iVar5 = iVar5 + -1) {
        rhs[*(int *)((long)local_a8 + lVar7)] =
             rhs[*(int *)((long)local_a8 + lVar7)] -
             *(double *)((long)local_78 + lVar7 * 2) * dVar10;
        lVar7 = lVar7 + 4;
      }
      local_b0 = local_b0 + 1;
    }
  }
  return local_b0;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}